

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testRunStarting
          (StreamingReporterBase<Catch::CompactReporter> *this,TestRunInfo *_testRunInfo)

{
  LazyStat<Catch::TestRunInfo> *in_RSI;
  TestRunInfo *in_stack_ffffffffffffffe8;
  
  LazyStat<Catch::TestRunInfo>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }